

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FragmentOutputTests::init(FragmentOutputTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  char *pcVar4;
  FragmentOutputCase *pFVar5;
  OutputVec *pOVar6;
  ulong extraout_RAX;
  ulong uVar7;
  uint local_1adc;
  deUint32 seed;
  TestCaseGroup *randomGroup;
  FragmentOutput local_1ac8;
  OutputVec local_1ab8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a40;
  undefined1 local_1a19;
  FragmentOutput local_1a18;
  OutputVec local_1a08;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_19e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1990;
  undefined1 local_1969;
  FragmentOutput local_1968;
  OutputVec local_1958;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18e0;
  undefined1 local_18b9;
  FragmentOutput local_18b8;
  OutputVec local_18a8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1838;
  allocator<char> local_1811;
  undefined1 local_1810 [8];
  string precName_7;
  int local_17e8;
  Precision prec_7;
  int precNdx_7;
  int local_17d4;
  undefined1 local_17d0 [4];
  int ndx_3;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec_7;
  undefined1 local_17b0 [8];
  string fmtName_7;
  deUint32 format_7;
  int fmtNdx_7;
  TestCaseGroup *uintGroup_1;
  FragmentOutput local_1778;
  OutputVec local_1768;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16f0;
  undefined1 local_16c9;
  FragmentOutput local_16c8;
  OutputVec local_16b8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1640;
  undefined1 local_1619;
  FragmentOutput local_1618;
  OutputVec local_1608;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_15e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1590;
  undefined1 local_1569;
  FragmentOutput local_1568;
  OutputVec local_1558;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e8;
  allocator<char> local_14c1;
  undefined1 local_14c0 [8];
  string precName_6;
  int local_1498;
  Precision prec_6;
  int precNdx_6;
  int local_1484;
  undefined1 local_1480 [4];
  int ndx_2;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec_6;
  undefined1 local_1460 [8];
  string fmtName_6;
  deUint32 format_6;
  int fmtNdx_6;
  TestCaseGroup *intGroup_1;
  FragmentOutput local_1428;
  OutputVec local_1418;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_13f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0;
  undefined1 local_1379;
  FragmentOutput local_1378;
  OutputVec local_1368;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0;
  undefined1 local_12c9;
  FragmentOutput local_12c8;
  OutputVec local_12b8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1240;
  undefined1 local_1219;
  FragmentOutput local_1218;
  OutputVec local_1208;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_11f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  allocator<char> local_1171;
  undefined1 local_1170 [8];
  string precName_5;
  int local_1148;
  Precision prec_5;
  int precNdx_5;
  int local_1134;
  undefined1 local_1130 [4];
  int ndx_1;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec_5;
  undefined1 local_1110 [8];
  string fmtName_5;
  deUint32 format_5;
  int fmtNdx_5;
  TestCaseGroup *fixedGroup_1;
  FragmentOutput local_10d8;
  OutputVec local_10c8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_10a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  undefined1 local_1029;
  FragmentOutput local_1028;
  OutputVec local_1018;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  undefined1 local_f79;
  FragmentOutput local_f78;
  OutputVec local_f68;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_f48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  undefined1 local_ec9;
  FragmentOutput local_ec8;
  OutputVec local_eb8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e40;
  allocator<char> local_e19;
  undefined1 local_e18 [8];
  string precName_4;
  int local_df0;
  Precision prec_4;
  int precNdx_4;
  int local_ddc;
  undefined1 local_dd8 [4];
  int ndx;
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec_4;
  undefined1 local_db8 [8];
  string fmtName_4;
  deUint32 format_4;
  int fmtNdx_4;
  TestCaseGroup *floatGroup_1;
  int numTargets;
  int samples_1;
  int height_1;
  int width_1;
  TestCaseGroup *arrayGroup;
  FragmentOutput local_d68;
  OutputVec local_d58;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce0;
  undefined1 local_cb9;
  FragmentOutput local_cb8;
  OutputVec local_ca8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  undefined1 local_c09;
  FragmentOutput local_c08;
  OutputVec local_bf8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  undefined1 local_b59;
  FragmentOutput local_b58;
  OutputVec local_b48;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  allocator<char> local_aa9;
  undefined1 local_aa8 [8];
  string precName_3;
  Precision prec_3;
  int precNdx_3;
  undefined1 local_a70 [8];
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec_3;
  undefined1 local_a50 [8];
  string fmtName_3;
  deUint32 format_3;
  int fmtNdx_3;
  TestCaseGroup *uintGroup;
  FragmentOutput local_a18;
  OutputVec local_a08;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 local_969;
  FragmentOutput local_968;
  OutputVec local_958;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  undefined1 local_8b9;
  FragmentOutput local_8b8;
  OutputVec local_8a8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  undefined1 local_809;
  FragmentOutput local_808;
  OutputVec local_7f8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  allocator<char> local_759;
  undefined1 local_758 [8];
  string precName_2;
  Precision prec_2;
  int precNdx_2;
  undefined1 local_720 [8];
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec_2;
  undefined1 local_700 [8];
  string fmtName_2;
  deUint32 format_2;
  int fmtNdx_2;
  TestCaseGroup *intGroup;
  FragmentOutput local_6c8;
  OutputVec local_6b8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  undefined1 local_619;
  FragmentOutput local_618;
  OutputVec local_608;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  undefined1 local_569;
  FragmentOutput local_568;
  OutputVec local_558;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  undefined1 local_4b9;
  FragmentOutput local_4b8;
  OutputVec local_4a8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  allocator<char> local_409;
  undefined1 local_408 [8];
  string precName_1;
  Precision prec_1;
  int precNdx_1;
  undefined1 local_3d0 [8];
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec_1;
  undefined1 local_3b0 [8];
  string fmtName_1;
  deUint32 format_1;
  int fmtNdx_1;
  TestCaseGroup *fixedGroup;
  FragmentOutput local_378;
  OutputVec local_368;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2c9;
  FragmentOutput local_2c8;
  OutputVec local_2b8;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_219;
  FragmentOutput local_218;
  OutputVec local_208;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_169;
  FragmentOutput local_168;
  OutputVec local_158;
  vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string precName;
  Precision prec;
  int precNdx;
  undefined1 local_80 [8];
  vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
  fboSpec;
  undefined1 local_60 [8];
  string fmtName;
  deUint32 format;
  int fmtNdx;
  TestCaseGroup *floatGroup;
  int samples;
  int height;
  int width;
  TestCaseGroup *basicGroup;
  FragmentOutputTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic fragment output tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"float",
             "Floating-point output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName.field_2._12_4_ = 0; (int)fmtName.field_2._12_4_ < 7;
      fmtName.field_2._12_4_ = fmtName.field_2._12_4_ + 1) {
    fmtName.field_2._8_4_ = init::requiredFloatFormats[(int)fmtName.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_80);
    BufferSpec::BufferSpec((BufferSpec *)&prec,fmtName.field_2._8_4_,0x40,0x40,0);
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 *)local_80,(value_type *)&prec);
    for (precName.field_2._12_4_ = 0; (int)precName.field_2._12_4_ < 3;
        precName.field_2._12_4_ = precName.field_2._12_4_ + 1) {
      precName.field_2._8_4_ = init::precisions[(int)precName.field_2._12_4_];
      pcVar4 = glu::getPrecisionName(precName.field_2._8_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,pcVar4,&local_b9);
      std::allocator<char>::~allocator(&local_b9);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_169 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "_");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::operator+(&local_e0,&local_100,"_float");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_158.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_158);
      FragmentOutput::FragmentOutput(&local_168,TYPE_FLOAT,precName.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_158,&local_168);
      OutputVec::toVec(&local_138,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_80,&local_138);
      local_169 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_138);
      OutputVec::~OutputVec(&local_158);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_219 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "_");
      std::operator+(&local_1b0,&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::operator+(&local_190,&local_1b0,"_vec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_208.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_208);
      FragmentOutput::FragmentOutput(&local_218,TYPE_FLOAT_VEC2,precName.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_208,&local_218);
      OutputVec::toVec(&local_1e8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_80,&local_1e8);
      local_219 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1e8);
      OutputVec::~OutputVec(&local_208);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_2c9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "_");
      std::operator+(&local_260,&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::operator+(&local_240,&local_260,"_vec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_2b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_2b8);
      FragmentOutput::FragmentOutput(&local_2c8,TYPE_FLOAT_VEC3,precName.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_2b8,&local_2c8);
      OutputVec::toVec(&local_298,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_80,&local_298);
      local_2c9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_298);
      OutputVec::~OutputVec(&local_2b8);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "_");
      std::operator+(&local_310,&local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::operator+(&local_2f0,&local_310,"_vec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_368.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_368.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_368.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_368);
      FragmentOutput::FragmentOutput(&local_378,TYPE_FLOAT_VEC4,precName.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_368,&local_378);
      OutputVec::toVec(&local_348,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_80,&local_348);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_348);
      OutputVec::~OutputVec(&local_368);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)local_b8);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_80);
    std::__cxx11::string::~string((string *)local_60);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fixed",
             "Fixed-point output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName_1.field_2._12_4_ = 0; (int)fmtName_1.field_2._12_4_ < 9;
      fmtName_1.field_2._12_4_ = fmtName_1.field_2._12_4_ + 1) {
    fmtName_1.field_2._8_4_ = init::requiredFixedFormats[(int)fmtName_1.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName_1.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3b0,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec_1.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec_1.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_3d0);
    BufferSpec::BufferSpec((BufferSpec *)&prec_1,fmtName_1.field_2._8_4_,0x40,0x40,0);
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 *)local_3d0,(value_type *)&prec_1);
    for (precName_1.field_2._12_4_ = 0; (int)precName_1.field_2._12_4_ < 3;
        precName_1.field_2._12_4_ = precName_1.field_2._12_4_ + 1) {
      precName_1.field_2._8_4_ = init::precisions[(int)precName_1.field_2._12_4_];
      pcVar4 = glu::getPrecisionName(precName_1.field_2._8_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_408,pcVar4,&local_409);
      std::allocator<char>::~allocator(&local_409);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_4b9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                     "_");
      std::operator+(&local_450,&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
      ;
      std::operator+(&local_430,&local_450,"_float");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_4a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_4a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_4a8);
      FragmentOutput::FragmentOutput(&local_4b8,TYPE_FLOAT,precName_1.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_4a8,&local_4b8);
      OutputVec::toVec(&local_488,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_3d0,&local_488);
      local_4b9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_488);
      OutputVec::~OutputVec(&local_4a8);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_470);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_569 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                     "_");
      std::operator+(&local_500,&local_520,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
      ;
      std::operator+(&local_4e0,&local_500,"_vec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_558.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_558.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_558.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_558);
      FragmentOutput::FragmentOutput(&local_568,TYPE_FLOAT_VEC2,precName_1.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_558,&local_568);
      OutputVec::toVec(&local_538,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_3d0,&local_538);
      local_569 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_538);
      OutputVec::~OutputVec(&local_558);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_619 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_5d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                     "_");
      std::operator+(&local_5b0,&local_5d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
      ;
      std::operator+(&local_590,&local_5b0,"_vec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_608.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_608.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_608.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_608);
      FragmentOutput::FragmentOutput(&local_618,TYPE_FLOAT_VEC3,precName_1.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_608,&local_618);
      OutputVec::toVec(&local_5e8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_3d0,&local_5e8);
      local_619 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_5e8);
      OutputVec::~OutputVec(&local_608);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5d0);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_680,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b0,
                     "_");
      std::operator+(&local_660,&local_680,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408)
      ;
      std::operator+(&local_640,&local_660,"_vec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_6b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_6b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_6b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_6b8);
      FragmentOutput::FragmentOutput(&local_6c8,TYPE_FLOAT_VEC4,precName_1.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_6b8,&local_6c8);
      OutputVec::toVec(&local_698,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_3d0,&local_698);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_698);
      OutputVec::~OutputVec(&local_6b8);
      std::__cxx11::string::~string((string *)&local_640);
      std::__cxx11::string::~string((string *)&local_660);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)local_408);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_3d0);
    std::__cxx11::string::~string((string *)local_3b0);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"int",
             "Integer output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName_2.field_2._12_4_ = 0; (int)fmtName_2.field_2._12_4_ < 9;
      fmtName_2.field_2._12_4_ = fmtName_2.field_2._12_4_ + 1) {
    fmtName_2.field_2._8_4_ = init::requiredIntFormats[(int)fmtName_2.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName_2.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_700,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec_2.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec_2.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_720);
    BufferSpec::BufferSpec((BufferSpec *)&prec_2,fmtName_2.field_2._8_4_,0x40,0x40,0);
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 *)local_720,(value_type *)&prec_2);
    for (precName_2.field_2._12_4_ = 0; (int)precName_2.field_2._12_4_ < 3;
        precName_2.field_2._12_4_ = precName_2.field_2._12_4_ + 1) {
      precName_2.field_2._8_4_ = init::precisions[(int)precName_2.field_2._12_4_];
      pcVar4 = glu::getPrecisionName(precName_2.field_2._8_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_758,pcVar4,&local_759);
      std::allocator<char>::~allocator(&local_759);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_809 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_7c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "_");
      std::operator+(&local_7a0,&local_7c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758)
      ;
      std::operator+(&local_780,&local_7a0,"_int");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_7f8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_7f8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_7f8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_7f8);
      FragmentOutput::FragmentOutput(&local_808,TYPE_INT,precName_2.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_7f8,&local_808);
      OutputVec::toVec(&local_7d8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_720,&local_7d8);
      local_809 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_7d8);
      OutputVec::~OutputVec(&local_7f8);
      std::__cxx11::string::~string((string *)&local_780);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_7c0);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_8b9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_870,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "_");
      std::operator+(&local_850,&local_870,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758)
      ;
      std::operator+(&local_830,&local_850,"_ivec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_8a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_8a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_8a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_8a8);
      FragmentOutput::FragmentOutput(&local_8b8,TYPE_INT_VEC2,precName_2.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_8a8,&local_8b8);
      OutputVec::toVec(&local_888,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_720,&local_888);
      local_8b9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_888);
      OutputVec::~OutputVec(&local_8a8);
      std::__cxx11::string::~string((string *)&local_830);
      std::__cxx11::string::~string((string *)&local_850);
      std::__cxx11::string::~string((string *)&local_870);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_969 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_920,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "_");
      std::operator+(&local_900,&local_920,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758)
      ;
      std::operator+(&local_8e0,&local_900,"_ivec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_958.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_958.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_958.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_958);
      FragmentOutput::FragmentOutput(&local_968,TYPE_INT_VEC3,precName_2.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_958,&local_968);
      OutputVec::toVec(&local_938,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_720,&local_938);
      local_969 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_938);
      OutputVec::~OutputVec(&local_958);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_920);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_9d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700,
                     "_");
      std::operator+(&local_9b0,&local_9d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_758)
      ;
      std::operator+(&local_990,&local_9b0,"_ivec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_a08.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a08.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a08.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_a08);
      FragmentOutput::FragmentOutput(&local_a18,TYPE_INT_VEC4,precName_2.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_a08,&local_a18);
      OutputVec::toVec(&local_9e8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_720,&local_9e8);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_9e8);
      OutputVec::~OutputVec(&local_a08);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_9b0);
      std::__cxx11::string::~string((string *)&local_9d0);
      std::__cxx11::string::~string((string *)local_758);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_720);
    std::__cxx11::string::~string((string *)local_700);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"uint",
             "Usigned integer output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName_3.field_2._12_4_ = 0; (int)fmtName_3.field_2._12_4_ < 10;
      fmtName_3.field_2._12_4_ = fmtName_3.field_2._12_4_ + 1) {
    fmtName_3.field_2._8_4_ = init::requiredUintFormats[(int)fmtName_3.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName_3.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a50,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec_3.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec_3.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_a70);
    BufferSpec::BufferSpec((BufferSpec *)&prec_3,fmtName_3.field_2._8_4_,0x40,0x40,0);
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 *)local_a70,(value_type *)&prec_3);
    for (precName_3.field_2._12_4_ = 0; (int)precName_3.field_2._12_4_ < 3;
        precName_3.field_2._12_4_ = precName_3.field_2._12_4_ + 1) {
      precName_3.field_2._8_4_ = init::precisions[(int)precName_3.field_2._12_4_];
      pcVar4 = glu::getPrecisionName(precName_3.field_2._8_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_aa8,pcVar4,&local_aa9);
      std::allocator<char>::~allocator(&local_aa9);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_b59 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_b10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a50,
                     "_");
      std::operator+(&local_af0,&local_b10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa8)
      ;
      std::operator+(&local_ad0,&local_af0,"_uint");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_b48.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b48.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b48.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_b48);
      FragmentOutput::FragmentOutput(&local_b58,TYPE_UINT,precName_3.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_b48,&local_b58);
      OutputVec::toVec(&local_b28,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_a70,&local_b28);
      local_b59 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_b28);
      OutputVec::~OutputVec(&local_b48);
      std::__cxx11::string::~string((string *)&local_ad0);
      std::__cxx11::string::~string((string *)&local_af0);
      std::__cxx11::string::~string((string *)&local_b10);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_c09 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_bc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a50,
                     "_");
      std::operator+(&local_ba0,&local_bc0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa8)
      ;
      std::operator+(&local_b80,&local_ba0,"_uvec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_bf8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_bf8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_bf8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_bf8);
      FragmentOutput::FragmentOutput(&local_c08,TYPE_UINT_VEC2,precName_3.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_bf8,&local_c08);
      OutputVec::toVec(&local_bd8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_a70,&local_bd8);
      local_c09 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_bd8);
      OutputVec::~OutputVec(&local_bf8);
      std::__cxx11::string::~string((string *)&local_b80);
      std::__cxx11::string::~string((string *)&local_ba0);
      std::__cxx11::string::~string((string *)&local_bc0);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_cb9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_c70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a50,
                     "_");
      std::operator+(&local_c50,&local_c70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa8)
      ;
      std::operator+(&local_c30,&local_c50,"_uvec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_ca8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_ca8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_ca8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_ca8);
      FragmentOutput::FragmentOutput(&local_cb8,TYPE_UINT_VEC3,precName_3.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_ca8,&local_cb8);
      OutputVec::toVec(&local_c88,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_a70,&local_c88);
      local_cb9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_c88);
      OutputVec::~OutputVec(&local_ca8);
      std::__cxx11::string::~string((string *)&local_c30);
      std::__cxx11::string::~string((string *)&local_c50);
      std::__cxx11::string::~string((string *)&local_c70);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_d20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a50,
                     "_");
      std::operator+(&local_d00,&local_d20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa8)
      ;
      std::operator+(&local_ce0,&local_d00,"_uvec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_d58.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d58.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d58.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_d58);
      FragmentOutput::FragmentOutput(&local_d68,TYPE_UINT_VEC4,precName_3.field_2._8_4_,0,0);
      pOVar6 = OutputVec::operator<<(&local_d58,&local_d68);
      OutputVec::toVec(&local_d38,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_a70,&local_d38);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_d38);
      OutputVec::~OutputVec(&local_d58);
      std::__cxx11::string::~string((string *)&local_ce0);
      std::__cxx11::string::~string((string *)&local_d00);
      std::__cxx11::string::~string((string *)&local_d20);
      std::__cxx11::string::~string((string *)local_aa8);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_a70);
    std::__cxx11::string::~string((string *)local_a50);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"array",
             "Array outputs");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"float",
             "Floating-point output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName_4.field_2._12_4_ = 0; (int)fmtName_4.field_2._12_4_ < 7;
      fmtName_4.field_2._12_4_ = fmtName_4.field_2._12_4_ + 1) {
    fmtName_4.field_2._8_4_ = init::requiredFloatFormats[(int)fmtName_4.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName_4.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_db8,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec_4.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec_4.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_dd8);
    for (local_ddc = 0; local_ddc < 3; local_ddc = local_ddc + 1) {
      BufferSpec::BufferSpec((BufferSpec *)&prec_4,fmtName_4.field_2._8_4_,0x40,0x40,0);
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   *)local_dd8,(value_type *)&prec_4);
    }
    for (local_df0 = 0; local_df0 < 3; local_df0 = local_df0 + 1) {
      precName_4.field_2._12_4_ = init::precisions[local_df0];
      pcVar4 = glu::getPrecisionName(precName_4.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_e18,pcVar4,&local_e19);
      std::allocator<char>::~allocator(&local_e19);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_ec9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_e80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db8,
                     "_");
      std::operator+(&local_e60,&local_e80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18)
      ;
      std::operator+(&local_e40,&local_e60,"_float");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_eb8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_eb8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_eb8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_eb8);
      FragmentOutput::FragmentOutput(&local_ec8,TYPE_FLOAT,precName_4.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_eb8,&local_ec8);
      OutputVec::toVec(&local_e98,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_dd8,&local_e98);
      local_ec9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_e98);
      OutputVec::~OutputVec(&local_eb8);
      std::__cxx11::string::~string((string *)&local_e40);
      std::__cxx11::string::~string((string *)&local_e60);
      std::__cxx11::string::~string((string *)&local_e80);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_f79 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_f30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db8,
                     "_");
      std::operator+(&local_f10,&local_f30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18)
      ;
      std::operator+(&local_ef0,&local_f10,"_vec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_f68.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f68.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f68.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_f68);
      FragmentOutput::FragmentOutput(&local_f78,TYPE_FLOAT_VEC2,precName_4.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_f68,&local_f78);
      OutputVec::toVec(&local_f48,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_dd8,&local_f48);
      local_f79 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_f48);
      OutputVec::~OutputVec(&local_f68);
      std::__cxx11::string::~string((string *)&local_ef0);
      std::__cxx11::string::~string((string *)&local_f10);
      std::__cxx11::string::~string((string *)&local_f30);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_1029 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_fe0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db8,
                     "_");
      std::operator+(&local_fc0,&local_fe0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18)
      ;
      std::operator+(&local_fa0,&local_fc0,"_vec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1018.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1018.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1018.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1018);
      FragmentOutput::FragmentOutput(&local_1028,TYPE_FLOAT_VEC3,precName_4.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1018,&local_1028);
      OutputVec::toVec(&local_ff8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_dd8,&local_ff8);
      local_1029 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_ff8);
      OutputVec::~OutputVec(&local_1018);
      std::__cxx11::string::~string((string *)&local_fa0);
      std::__cxx11::string::~string((string *)&local_fc0);
      std::__cxx11::string::~string((string *)&local_fe0);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1090,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db8,
                     "_");
      std::operator+(&local_1070,&local_1090,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e18)
      ;
      std::operator+(&local_1050,&local_1070,"_vec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_10c8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_10c8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_10c8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_10c8);
      FragmentOutput::FragmentOutput(&local_10d8,TYPE_FLOAT_VEC4,precName_4.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_10c8,&local_10d8);
      OutputVec::toVec(&local_10a8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_dd8,&local_10a8);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_10a8);
      OutputVec::~OutputVec(&local_10c8);
      std::__cxx11::string::~string((string *)&local_1050);
      std::__cxx11::string::~string((string *)&local_1070);
      std::__cxx11::string::~string((string *)&local_1090);
      std::__cxx11::string::~string((string *)local_e18);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_dd8);
    std::__cxx11::string::~string((string *)local_db8);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fixed",
             "Fixed-point output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName_5.field_2._12_4_ = 0; (int)fmtName_5.field_2._12_4_ < 9;
      fmtName_5.field_2._12_4_ = fmtName_5.field_2._12_4_ + 1) {
    fmtName_5.field_2._8_4_ = init::requiredFixedFormats[(int)fmtName_5.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName_5.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1110,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec_5.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec_5.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_1130);
    for (local_1134 = 0; local_1134 < 3; local_1134 = local_1134 + 1) {
      BufferSpec::BufferSpec((BufferSpec *)&prec_5,fmtName_5.field_2._8_4_,0x40,0x40,0);
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   *)local_1130,(value_type *)&prec_5);
    }
    for (local_1148 = 0; local_1148 < 3; local_1148 = local_1148 + 1) {
      precName_5.field_2._12_4_ = init::precisions[local_1148];
      pcVar4 = glu::getPrecisionName(precName_5.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1170,pcVar4,&local_1171);
      std::allocator<char>::~allocator(&local_1171);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_1219 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_11d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1110
                     ,"_");
      std::operator+(&local_11b8,&local_11d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1170
                    );
      std::operator+(&local_1198,&local_11b8,"_float");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1208.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1208.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1208.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1208);
      FragmentOutput::FragmentOutput(&local_1218,TYPE_FLOAT,precName_5.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1208,&local_1218);
      OutputVec::toVec(&local_11f0,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1130,&local_11f0);
      local_1219 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_11f0);
      OutputVec::~OutputVec(&local_1208);
      std::__cxx11::string::~string((string *)&local_1198);
      std::__cxx11::string::~string((string *)&local_11b8);
      std::__cxx11::string::~string((string *)&local_11d8);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_12c9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1110
                     ,"_");
      std::operator+(&local_1260,&local_1280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1170
                    );
      std::operator+(&local_1240,&local_1260,"_vec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_12b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_12b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_12b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_12b8);
      FragmentOutput::FragmentOutput(&local_12c8,TYPE_FLOAT_VEC2,precName_5.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_12b8,&local_12c8);
      OutputVec::toVec(&local_1298,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1130,&local_1298);
      local_12c9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1298);
      OutputVec::~OutputVec(&local_12b8);
      std::__cxx11::string::~string((string *)&local_1240);
      std::__cxx11::string::~string((string *)&local_1260);
      std::__cxx11::string::~string((string *)&local_1280);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_1379 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1110
                     ,"_");
      std::operator+(&local_1310,&local_1330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1170
                    );
      std::operator+(&local_12f0,&local_1310,"_vec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1368.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1368.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1368.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1368);
      FragmentOutput::FragmentOutput(&local_1378,TYPE_FLOAT_VEC3,precName_5.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1368,&local_1378);
      OutputVec::toVec(&local_1348,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1130,&local_1348);
      local_1379 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1348);
      OutputVec::~OutputVec(&local_1368);
      std::__cxx11::string::~string((string *)&local_12f0);
      std::__cxx11::string::~string((string *)&local_1310);
      std::__cxx11::string::~string((string *)&local_1330);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_13e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1110
                     ,"_");
      std::operator+(&local_13c0,&local_13e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1170
                    );
      std::operator+(&local_13a0,&local_13c0,"_vec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1418.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1418.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1418.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1418);
      FragmentOutput::FragmentOutput(&local_1428,TYPE_FLOAT_VEC4,precName_5.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1418,&local_1428);
      OutputVec::toVec(&local_13f8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1130,&local_13f8);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_13f8);
      OutputVec::~OutputVec(&local_1418);
      std::__cxx11::string::~string((string *)&local_13a0);
      std::__cxx11::string::~string((string *)&local_13c0);
      std::__cxx11::string::~string((string *)&local_13e0);
      std::__cxx11::string::~string((string *)local_1170);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_1130);
    std::__cxx11::string::~string((string *)local_1110);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"int",
             "Integer output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName_6.field_2._12_4_ = 0; (int)fmtName_6.field_2._12_4_ < 9;
      fmtName_6.field_2._12_4_ = fmtName_6.field_2._12_4_ + 1) {
    fmtName_6.field_2._8_4_ = init::requiredIntFormats[(int)fmtName_6.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName_6.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1460,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec_6.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec_6.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_1480);
    for (local_1484 = 0; local_1484 < 3; local_1484 = local_1484 + 1) {
      BufferSpec::BufferSpec((BufferSpec *)&prec_6,fmtName_6.field_2._8_4_,0x40,0x40,0);
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   *)local_1480,(value_type *)&prec_6);
    }
    for (local_1498 = 0; local_1498 < 3; local_1498 = local_1498 + 1) {
      precName_6.field_2._12_4_ = init::precisions[local_1498];
      pcVar4 = glu::getPrecisionName(precName_6.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_14c0,pcVar4,&local_14c1);
      std::allocator<char>::~allocator(&local_14c1);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_1569 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1460
                     ,"_");
      std::operator+(&local_1508,&local_1528,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14c0
                    );
      std::operator+(&local_14e8,&local_1508,"_int");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1558.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1558.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1558.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1558);
      FragmentOutput::FragmentOutput(&local_1568,TYPE_INT,precName_6.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1558,&local_1568);
      OutputVec::toVec(&local_1540,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1480,&local_1540);
      local_1569 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1540);
      OutputVec::~OutputVec(&local_1558);
      std::__cxx11::string::~string((string *)&local_14e8);
      std::__cxx11::string::~string((string *)&local_1508);
      std::__cxx11::string::~string((string *)&local_1528);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_1619 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_15d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1460
                     ,"_");
      std::operator+(&local_15b0,&local_15d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14c0
                    );
      std::operator+(&local_1590,&local_15b0,"_ivec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1608.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1608.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1608.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1608);
      FragmentOutput::FragmentOutput(&local_1618,TYPE_INT_VEC2,precName_6.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1608,&local_1618);
      OutputVec::toVec(&local_15e8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1480,&local_15e8);
      local_1619 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_15e8);
      OutputVec::~OutputVec(&local_1608);
      std::__cxx11::string::~string((string *)&local_1590);
      std::__cxx11::string::~string((string *)&local_15b0);
      std::__cxx11::string::~string((string *)&local_15d0);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_16c9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1680,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1460
                     ,"_");
      std::operator+(&local_1660,&local_1680,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14c0
                    );
      std::operator+(&local_1640,&local_1660,"_ivec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_16b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_16b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_16b8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_16b8);
      FragmentOutput::FragmentOutput(&local_16c8,TYPE_INT_VEC3,precName_6.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_16b8,&local_16c8);
      OutputVec::toVec(&local_1698,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1480,&local_1698);
      local_16c9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1698);
      OutputVec::~OutputVec(&local_16b8);
      std::__cxx11::string::~string((string *)&local_1640);
      std::__cxx11::string::~string((string *)&local_1660);
      std::__cxx11::string::~string((string *)&local_1680);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1730,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1460
                     ,"_");
      std::operator+(&local_1710,&local_1730,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14c0
                    );
      std::operator+(&local_16f0,&local_1710,"_ivec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1768.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1768.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1768.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1768);
      FragmentOutput::FragmentOutput(&local_1778,TYPE_INT_VEC4,precName_6.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1768,&local_1778);
      OutputVec::toVec(&local_1748,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_1480,&local_1748);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1748);
      OutputVec::~OutputVec(&local_1768);
      std::__cxx11::string::~string((string *)&local_16f0);
      std::__cxx11::string::~string((string *)&local_1710);
      std::__cxx11::string::~string((string *)&local_1730);
      std::__cxx11::string::~string((string *)local_14c0);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_1480);
    std::__cxx11::string::~string((string *)local_1460);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"uint",
             "Usigned integer output tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (fmtName_7.field_2._12_4_ = 0; (int)fmtName_7.field_2._12_4_ < 10;
      fmtName_7.field_2._12_4_ = fmtName_7.field_2._12_4_ + 1) {
    fmtName_7.field_2._8_4_ = init::requiredUintFormats[(int)fmtName_7.field_2._12_4_];
    pcVar4 = FboTestUtil::getFormatName(fmtName_7.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_17b0,pcVar4,
               (allocator<char> *)
               ((long)&fboSpec_7.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fboSpec_7.
                       super__Vector_base<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              *)local_17d0);
    for (local_17d4 = 0; local_17d4 < 3; local_17d4 = local_17d4 + 1) {
      BufferSpec::BufferSpec((BufferSpec *)&prec_7,fmtName_7.field_2._8_4_,0x40,0x40,0);
      std::
      vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
      ::push_back((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                   *)local_17d0,(value_type *)&prec_7);
    }
    for (local_17e8 = 0; local_17e8 < 3; local_17e8 = local_17e8 + 1) {
      precName_7.field_2._12_4_ = init::precisions[local_17e8];
      pcVar4 = glu::getPrecisionName(precName_7.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_1810,pcVar4,&local_1811);
      std::allocator<char>::~allocator(&local_1811);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_18b9 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17b0
                     ,"_");
      std::operator+(&local_1858,&local_1878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1810
                    );
      std::operator+(&local_1838,&local_1858,"_uint");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_18a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_18a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_18a8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_18a8);
      FragmentOutput::FragmentOutput(&local_18b8,TYPE_UINT,precName_7.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_18a8,&local_18b8);
      OutputVec::toVec(&local_1890,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_17d0,&local_1890);
      local_18b9 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1890);
      OutputVec::~OutputVec(&local_18a8);
      std::__cxx11::string::~string((string *)&local_1838);
      std::__cxx11::string::~string((string *)&local_1858);
      std::__cxx11::string::~string((string *)&local_1878);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_1969 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1920,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17b0
                     ,"_");
      std::operator+(&local_1900,&local_1920,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1810
                    );
      std::operator+(&local_18e0,&local_1900,"_uvec2");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1958.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1958.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1958.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1958);
      FragmentOutput::FragmentOutput(&local_1968,TYPE_UINT_VEC2,precName_7.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1958,&local_1968);
      OutputVec::toVec(&local_1938,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_17d0,&local_1938);
      local_1969 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1938);
      OutputVec::~OutputVec(&local_1958);
      std::__cxx11::string::~string((string *)&local_18e0);
      std::__cxx11::string::~string((string *)&local_1900);
      std::__cxx11::string::~string((string *)&local_1920);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      local_1a19 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_19d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17b0
                     ,"_");
      std::operator+(&local_19b0,&local_19d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1810
                    );
      std::operator+(&local_1990,&local_19b0,"_uvec3");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1a08.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a08.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a08.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1a08);
      FragmentOutput::FragmentOutput(&local_1a18,TYPE_UINT_VEC3,precName_7.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1a08,&local_1a18);
      OutputVec::toVec(&local_19e8,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_17d0,&local_19e8);
      local_1a19 = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_19e8);
      OutputVec::~OutputVec(&local_1a08);
      std::__cxx11::string::~string((string *)&local_1990);
      std::__cxx11::string::~string((string *)&local_19b0);
      std::__cxx11::string::~string((string *)&local_19d0);
      pFVar5 = (FragmentOutputCase *)operator_new(0xd0);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_1a80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_17b0
                     ,"_");
      std::operator+(&local_1a60,&local_1a80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1810
                    );
      std::operator+(&local_1a40,&local_1a60,"_uvec4");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      local_1ab8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1ab8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1ab8.outputs.
      super__Vector_base<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      OutputVec::OutputVec(&local_1ab8);
      FragmentOutput::FragmentOutput(&local_1ac8,TYPE_UINT_VEC4,precName_7.field_2._12_4_,0,3);
      pOVar6 = OutputVec::operator<<(&local_1ab8,&local_1ac8);
      OutputVec::toVec(&local_1a98,pOVar6);
      FragmentOutputCase::FragmentOutputCase
                (pFVar5,pCVar1,pcVar4,"",
                 (vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                  *)local_17d0,&local_1a98);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pFVar5);
      std::
      vector<deqp::gles3::Functional::FragmentOutput,_std::allocator<deqp::gles3::Functional::FragmentOutput>_>
      ::~vector(&local_1a98);
      OutputVec::~OutputVec(&local_1ab8);
      std::__cxx11::string::~string((string *)&local_1a40);
      std::__cxx11::string::~string((string *)&local_1a60);
      std::__cxx11::string::~string((string *)&local_1a80);
      std::__cxx11::string::~string((string *)local_1810);
    }
    std::
    vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
    ::~vector((vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
               *)local_17d0);
    std::__cxx11::string::~string((string *)local_17b0);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random fragment output cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_1adc = 0;
  uVar7 = extraout_RAX;
  while (local_1adc < 100) {
    pFVar5 = createRandomCase((this->super_TestCaseGroup).m_context,2,4,local_1adc);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pFVar5);
    local_1adc = local_1adc + 1;
    uVar7 = (ulong)local_1adc;
  }
  return (int)uVar7;
}

Assistant:

void FragmentOutputTests::init (void)
{
	static const deUint32 requiredFloatFormats[] =
	{
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F
	};
	static const deUint32 requiredFixedFormats[] =
	{
		GL_RGBA8,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGBA4,
		GL_RGB5_A1,
		GL_RGB8,
		GL_RGB565,
		GL_RG8,
		GL_R8
	};
	static const deUint32 requiredIntFormats[] =
	{
		GL_RGBA32I,
		GL_RGBA16I,
		GL_RGBA8I,
		GL_RG32I,
		GL_RG16I,
		GL_RG8I,
		GL_R32I,
		GL_R16I,
		GL_R8I
	};
	static const deUint32 requiredUintFormats[] =
	{
		GL_RGBA32UI,
		GL_RGBA16UI,
		GL_RGBA8UI,
		GL_RGB10_A2UI,
		GL_RG32UI,
		GL_RG16UI,
		GL_RG8UI,
		GL_R32UI,
		GL_R16UI,
		GL_R8UI
	};

	static const glu::Precision precisions[] =
	{
		glu::PRECISION_LOWP,
		glu::PRECISION_MEDIUMP,
		glu::PRECISION_HIGHP
	};

	// .basic.
	{
		tcu::TestCaseGroup* basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic fragment output tests");
		addChild(basicGroup);

		const int	width	= 64;
		const int	height	= 64;
		const int	samples	= 0;

		// .float
		tcu::TestCaseGroup* floatGroup = new tcu::TestCaseGroup(m_testCtx, "float", "Floating-point output tests");
		basicGroup->addChild(floatGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFloatFormats); fmtNdx++)
		{
			deUint32			format		= requiredFloatFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .fixed
		tcu::TestCaseGroup* fixedGroup = new tcu::TestCaseGroup(m_testCtx, "fixed", "Fixed-point output tests");
		basicGroup->addChild(fixedGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFixedFormats); fmtNdx++)
		{
			deUint32			format		= requiredFixedFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .int
		tcu::TestCaseGroup* intGroup = new tcu::TestCaseGroup(m_testCtx, "int", "Integer output tests");
		basicGroup->addChild(intGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredIntFormats); fmtNdx++)
		{
			deUint32			format		= requiredIntFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_int").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT,		prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC2,	prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC3,	prec, 0)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC4,	prec, 0)).toVec()));
			}
		}

		// .uint
		tcu::TestCaseGroup* uintGroup = new tcu::TestCaseGroup(m_testCtx, "uint", "Usigned integer output tests");
		basicGroup->addChild(uintGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredUintFormats); fmtNdx++)
		{
			deUint32			format		= requiredUintFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uint").c_str(),		"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT,			prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC2,	prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC3,	prec, 0)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC4,	prec, 0)).toVec()));
			}
		}
	}

	// .array
	{
		tcu::TestCaseGroup* arrayGroup = new tcu::TestCaseGroup(m_testCtx, "array", "Array outputs");
		addChild(arrayGroup);

		const int	width		= 64;
		const int	height		= 64;
		const int	samples		= 0;
		const int	numTargets	= 3;

		// .float
		tcu::TestCaseGroup* floatGroup = new tcu::TestCaseGroup(m_testCtx, "float", "Floating-point output tests");
		arrayGroup->addChild(floatGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFloatFormats); fmtNdx++)
		{
			deUint32			format		= requiredFloatFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0, numTargets)).toVec()));
				floatGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .fixed
		tcu::TestCaseGroup* fixedGroup = new tcu::TestCaseGroup(m_testCtx, "fixed", "Fixed-point output tests");
		arrayGroup->addChild(fixedGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredFixedFormats); fmtNdx++)
		{
			deUint32			format		= requiredFixedFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_float").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT,		prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC2,	prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC3,	prec, 0, numTargets)).toVec()));
				fixedGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_vec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_FLOAT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .int
		tcu::TestCaseGroup* intGroup = new tcu::TestCaseGroup(m_testCtx, "int", "Integer output tests");
		arrayGroup->addChild(intGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredIntFormats); fmtNdx++)
		{
			deUint32			format		= requiredIntFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_int").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT,		prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC2,	prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC3,	prec, 0, numTargets)).toVec()));
				intGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_ivec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_INT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}

		// .uint
		tcu::TestCaseGroup* uintGroup = new tcu::TestCaseGroup(m_testCtx, "uint", "Usigned integer output tests");
		arrayGroup->addChild(uintGroup);
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(requiredUintFormats); fmtNdx++)
		{
			deUint32			format		= requiredUintFormats[fmtNdx];
			string				fmtName		= getFormatName(format);
			vector<BufferSpec>	fboSpec;

			for (int ndx = 0; ndx < numTargets; ndx++)
				fboSpec.push_back(BufferSpec(format, width, height, samples));

			for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
			{
				glu::Precision	prec		= precisions[precNdx];
				string			precName	= glu::getPrecisionName(prec);

				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uint").c_str(),		"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT,			prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec2").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC2,	prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec3").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC3,	prec, 0, numTargets)).toVec()));
				uintGroup->addChild(new FragmentOutputCase(m_context, (fmtName + "_" + precName + "_uvec4").c_str(),	"",	fboSpec, (OutputVec() << FragmentOutput(glu::TYPE_UINT_VEC4,	prec, 0, numTargets)).toVec()));
			}
		}
	}

	// .random
	{
		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random fragment output cases");
		addChild(randomGroup);

		for (deUint32 seed = 0; seed < 100; seed++)
			randomGroup->addChild(createRandomCase(m_context, 2, 4, seed));
	}
}